

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O2

void __thiscall
QFutureInterfaceBasePrivate::~QFutureInterfaceBasePrivate(QFutureInterfaceBasePrivate *this)

{
  if (this->hasException == true) {
    std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)&(this->data).m_results);
  }
  else {
    QtPrivate::ResultStoreBase::~ResultStoreBase(&(this->data).m_results);
  }
  QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
  ::~QScopedPointer(&this->m_progress);
  std::_Function_base::~_Function_base(&(this->continuation).super__Function_base);
  QWaitCondition::~QWaitCondition(&this->pausedWaitCondition);
  QWaitCondition::~QWaitCondition(&this->waitCondition);
  QArrayDataPointer<QFutureCallOutInterface_*>::~QArrayDataPointer(&(this->outputConnections).d);
  QMutex::~QMutex(&this->m_mutex);
  return;
}

Assistant:

QFutureInterfaceBasePrivate::~QFutureInterfaceBasePrivate()
{
    if (hasException)
        data.m_exceptionStore.~ExceptionStore();
    else
        data.m_results.~ResultStoreBase();
}